

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfMultiPartInputFile.cpp
# Opt level: O2

void __thiscall Imf_3_4::MultiPartInputFile::flushPartCache(MultiPartInputFile *this)

{
  pthread_mutex_t *__mutex;
  element_type *peVar1;
  pointer pPVar2;
  Part *part;
  pointer pPVar3;
  
  __mutex = (pthread_mutex_t *)
            (this->_data).
            super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  std::mutex::lock((mutex *)&__mutex->__data);
  peVar1 = (this->_data).
           super___shared_ptr<Imf_3_4::MultiPartInputFile::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar2 = (peVar1->parts).
           super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pPVar3 = (peVar1->parts).
                super__Vector_base<Imf_3_4::MultiPartInputFile::Data::Part,_std::allocator<Imf_3_4::MultiPartInputFile::Data::Part>_>
                ._M_impl.super__Vector_impl_data._M_start; pPVar3 != pPVar2; pPVar3 = pPVar3 + 1) {
    std::any::reset(&pPVar3->file);
  }
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
MultiPartInputFile::flushPartCache ()
{
#if ILMTHREAD_THREADING_ENABLED
    std::lock_guard<std::mutex> lock (_data->_mx);
#endif
    for (auto &part: _data->parts)
        part.file.reset();
}